

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O3

void __thiscall PDFTextString::ConvertFromUTF8(PDFTextString *this,string *inStringToConvert)

{
  bool bVar1;
  OutputStringBufferStream *this_00;
  EStatusCodeAndString result;
  UnicodeString unicodeString;
  OutputStringBufferStream aStringStream;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  UnicodeString local_48;
  OutputStringBufferStream local_30;
  
  this_00 = &local_30;
  OutputStringBufferStream::OutputStringBufferStream(&local_30);
  bVar1 = ConvertUTF8ToPDFDocEncoding((PDFTextString *)this_00,inStringToConvert,&local_30);
  if (bVar1) {
    OutputStringBufferStream::ToString_abi_cxx11_((string *)local_70,&local_30);
    std::__cxx11::string::operator=((string *)this,(string *)local_70);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  else {
    UnicodeString::UnicodeString(&local_48);
    UnicodeString::FromUTF8(&local_48,inStringToConvert);
    UnicodeString::ToUTF16BE_abi_cxx11_((EStatusCodeAndString *)local_70,&local_48,true);
    std::__cxx11::string::_M_assign((string *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._8_8_ != &local_58) {
      operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
    }
    UnicodeString::~UnicodeString(&local_48);
  }
  OutputStringBufferStream::~OutputStringBufferStream(&local_30);
  return;
}

Assistant:

void PDFTextString::ConvertFromUTF8(const std::string& inStringToConvert)
{
	OutputStringBufferStream aStringStream;

	if(!ConvertUTF8ToPDFDocEncoding(inStringToConvert,aStringStream))
	{
		// if no DOC encoding then convert to utf16BE (with BOM)
		
		UnicodeString unicodeString;
		unicodeString.FromUTF8(inStringToConvert);
		EStatusCodeAndString result = unicodeString.ToUTF16BE(true);
		
		mTextString = result.second;

	}
	else
	{
		mTextString = aStringStream.ToString();
	}
}